

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O1

bool __thiscall UnifiedRegex::RegexPattern::IsUnicode(RegexPattern *this)

{
  bool bVar1;
  
  if (((((((this->library).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->config).
      threadConfig)->m_ES6Unicode == true) {
    bVar1 = (bool)((((this->rep).unified.program.ptr)->flags & UnicodeRegexFlag) >> 3);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RegexPattern::IsUnicode() const
    {
        return GetScriptContext()->GetConfig()->IsES6UnicodeExtensionsEnabled() && (rep.unified.program->flags & UnicodeRegexFlag) != 0;
    }